

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var __thiscall
Js::JavascriptNativeFloatArray::DirectGetItem(JavascriptNativeFloatArray *this,uint32 index)

{
  double value;
  bool bVar1;
  int iVar2;
  ScriptContext *scriptContext;
  Type *this_00;
  JavascriptLibrary *this_01;
  JavascriptNativeFloatArray *local_38;
  Var element;
  SparseArraySegmentBase *pSStack_28;
  uint32 offset;
  SparseArraySegment<double> *seg;
  JavascriptNativeFloatArray *pJStack_18;
  uint32 index_local;
  JavascriptNativeFloatArray *this_local;
  
  seg._4_4_ = index;
  pJStack_18 = this;
  pSStack_28 = Js::JavascriptArray::GetLastUsedSegment((JavascriptArray *)this);
  element._4_4_ = seg._4_4_ - pSStack_28->left;
  if (((seg._4_4_ < pSStack_28->left) || (pSStack_28->length <= element._4_4_)) ||
     (bVar1 = SparseArraySegment<double>::IsMissingItem
                        ((double *)(&pSStack_28[1].left + (ulong)element._4_4_ * 2)), bVar1)) {
    local_38 = (JavascriptNativeFloatArray *)0x0;
    iVar2 = (**(code **)((long)(this->super_JavascriptNativeArray).super_JavascriptArray.
                               super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                               super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))
                      (this,seg._4_4_,&local_38);
    if (iVar2 == 0) {
      this_00 = RecyclableObject::GetType((RecyclableObject *)this);
      this_01 = Js::Type::GetLibrary(this_00);
      this_local = (JavascriptNativeFloatArray *)
                   JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
    }
    else {
      this_local = local_38;
    }
  }
  else {
    value = *(double *)(&pSStack_28[1].left + (ulong)element._4_4_ * 2);
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_local = (JavascriptNativeFloatArray *)JavascriptNumber::ToVarWithCheck(value,scriptContext)
    ;
  }
  return this_local;
}

Assistant:

Var JavascriptNativeFloatArray::DirectGetItem(uint32 index)
    {
        SparseArraySegment<double> *seg = (SparseArraySegment<double>*)this->GetLastUsedSegment();
        uint32 offset = index - seg->left;
        if (index >= seg->left && offset < seg->length)
        {
            if (!SparseArraySegment<double>::IsMissingItem(&seg->elements[offset]))
            {
                return JavascriptNumber::ToVarWithCheck(seg->elements[offset], GetScriptContext());
            }
        }
        Var element = nullptr;
        if (DirectGetItemAtFull(index, &element))
        {
            return element;
        }
        return GetType()->GetLibrary()->GetUndefined();
    }